

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(void_*,_unsigned_long)>::Matches
          (OnCallSpec<void_(void_*,_unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
                    ((tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<void_*,_unsigned_long>_&>::Matches
                      ((MatcherBase<const_std::tuple<void_*,_unsigned_long>_&> *)(this + 0x40),args)
    ;
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }